

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checker.cpp
# Opt level: O2

void sqlcheck::CheckStatement(Configuration *state,string *sql_statement)

{
  _Alloc_hider _Var1;
  int iVar2;
  uint32_t uVar3;
  size_type sVar4;
  size_type sVar5;
  string statement;
  bool print_statement;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_40;
  
  std::__cxx11::string::string((string *)&statement,(string *)sql_statement);
  sVar4 = statement._M_string_length;
  _Var1 = statement._M_dataplus;
  for (sVar5 = 0; sVar4 != sVar5; sVar5 = sVar5 + 1) {
    iVar2 = tolower((int)_Var1._M_p[sVar5]);
    _Var1._M_p[sVar5] = (char)iVar2;
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&local_40,"^ +| +$|( ) +",0x10);
  std::
  regex_replace<std::__cxx11::regex_traits<char>,char,std::char_traits<char>,std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&print_statement,
             &statement,&local_40,"$1",0);
  std::__cxx11::string::operator=((string *)&statement,(string *)&print_statement);
  std::__cxx11::string::~string((string *)&print_statement);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_40);
  if (*statement._M_dataplus._M_p == '\n') {
    std::__cxx11::string::erase((ulong)&statement,0);
    std::__cxx11::string::_M_assign((string *)&statement);
    state->line_number = state->line_number + 1;
  }
  print_statement = true;
  CheckMultiValuedAttribute(state,&statement,&print_statement);
  CheckRecursiveDependency(state,&statement,&print_statement);
  CheckPrimaryKeyExists(state,&statement,&print_statement);
  CheckGenericPrimaryKey(state,&statement,&print_statement);
  CheckForeignKeyExists(state,&statement,&print_statement);
  CheckVariableAttribute(state,&statement,&print_statement);
  CheckMetadataTribbles(state,&statement,&print_statement);
  CheckFloat(state,&statement,&print_statement);
  CheckValuesInDefinition(state,&statement,&print_statement);
  CheckExternalFiles(state,&statement,&print_statement);
  CheckIndexCount(state,&statement,&print_statement);
  CheckIndexAttributeOrder(state,&statement,&print_statement);
  CheckSelectStar(state,&statement,&print_statement);
  CheckJoinWithoutEquality(state,&statement,&print_statement);
  CheckNullUsage(state,&statement,&print_statement);
  CheckNotNullUsage(state,&statement,&print_statement);
  CheckConcatenation(state,&statement,&print_statement);
  CheckGroupByUsage(state,&statement,&print_statement);
  CheckOrderByRand(state,&statement,&print_statement);
  CheckPatternMatching(state,&statement,&print_statement);
  CheckSpaghettiQuery(state,&statement,&print_statement);
  CheckJoinCount(state,&statement,&print_statement);
  CheckDistinctCount(state,&statement,&print_statement);
  CheckImplicitColumns(state,&statement,&print_statement);
  CheckHaving(state,&statement,&print_statement);
  CheckNesting(state,&statement,&print_statement);
  CheckOr(state,&statement,&print_statement);
  CheckUnion(state,&statement,&print_statement);
  CheckDistinctJoin(state,&statement,&print_statement);
  CheckReadablePasswords(state,&statement,&print_statement);
  uVar3 = state->line_number;
  for (sVar4 = 0; statement._M_string_length != sVar4; sVar4 = sVar4 + 1) {
    if (statement._M_dataplus._M_p[sVar4] == '\n') {
      uVar3 = uVar3 + 1;
      state->line_number = uVar3;
    }
  }
  std::__cxx11::string::~string((string *)&statement);
  return;
}

Assistant:

void CheckStatement(Configuration& state,
                    const std::string& sql_statement){

  // TRANSFORM TO LOWER CASE
  auto statement = sql_statement;

  std::transform(statement.begin(),
                 statement.end(),
                 statement.begin(),
                 ::tolower);

  // REMOVE SPACE
  statement = std::regex_replace(statement, std::regex("^ +| +$|( ) +"), "$1");

  // CHECK FOR LEADING NEWLINE
  if (statement[0] == '\n') {
    statement = statement.erase(0,1);
    state.line_number++;
  }

  // RESET
  bool print_statement = true;

  // LOGICAL DATABASE DESIGN

  CheckMultiValuedAttribute(state, statement, print_statement);

  CheckRecursiveDependency(state, statement, print_statement);

  CheckPrimaryKeyExists(state, statement, print_statement);

  CheckGenericPrimaryKey(state, statement, print_statement);

  CheckForeignKeyExists(state, statement, print_statement);

  CheckVariableAttribute(state, statement, print_statement);

  CheckMetadataTribbles(state, statement, print_statement);

  // PHYSICAL DATABASE DESIGN

  CheckFloat(state, statement, print_statement);

  CheckValuesInDefinition(state, statement, print_statement);

  CheckExternalFiles(state, statement, print_statement);

  CheckIndexCount(state, statement, print_statement);

  CheckIndexAttributeOrder(state, statement, print_statement);

  // QUERY

  CheckSelectStar(state, statement, print_statement);

  CheckJoinWithoutEquality(state, statement, print_statement);

  CheckNullUsage(state, statement, print_statement);

  CheckNotNullUsage(state, statement, print_statement);

  CheckConcatenation(state, statement, print_statement);

  CheckGroupByUsage(state, statement, print_statement);

  CheckOrderByRand(state, statement, print_statement);

  CheckPatternMatching(state, statement, print_statement);

  CheckSpaghettiQuery(state, statement, print_statement);

  CheckJoinCount(state, statement, print_statement);

  CheckDistinctCount(state, statement, print_statement);

  CheckImplicitColumns(state, statement, print_statement);

  CheckHaving(state, statement, print_statement);

  CheckNesting(state, statement, print_statement);

  CheckOr(state, statement, print_statement);

  CheckUnion(state, statement, print_statement);

  CheckDistinctJoin(state, statement, print_statement);

  // APPLICATION

  CheckReadablePasswords(state, statement, print_statement);




  // update state.line_number with number of line breaks in the statement that was just checked
  for (size_t i = 0; i < statement.length(); i++)
  {
      if (statement[i] == '\n')
      {
          state.line_number++;
      }
  }
}